

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *other;
  ulong uVar3;
  int iVar4;
  long lVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar3 = (ulong)(uint)count;
  iVar4 = this->stream_count_;
  while (0 < iVar4) {
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])(*this->streams_,uVar3);
    if ((char)iVar2 != '\0') break;
    lVar5 = CONCAT44(extraout_var,iVar1) + (long)(int)uVar3;
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    if (lVar5 <= CONCAT44(extraout_var_00,iVar1)) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0x15b);
      other = internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (final_byte_count) < (target_byte_count): ");
      internal::LogFinisher::operator=(&local_69,other);
      internal::LogMessage::~LogMessage(&local_68);
    }
    this->bytes_retired_ = this->bytes_retired_ + CONCAT44(extraout_var_00,iVar1);
    this->streams_ = this->streams_ + 1;
    iVar4 = this->stream_count_ + -1;
    this->stream_count_ = iVar4;
    uVar3 = (ulong)(uint)((int)lVar5 - iVar1);
  }
  return 0 < iVar4;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64_t target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64_t final_byte_count = streams_[0]->ByteCount();
    GOOGLE_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}